

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O0

void __thiscall
LASwriteItemCompressed_RGB14_v4::~LASwriteItemCompressed_RGB14_v4
          (LASwriteItemCompressed_RGB14_v4 *this)

{
  ArithmeticEncoder *this_00;
  uint local_14;
  U32 c;
  LASwriteItemCompressed_RGB14_v4 *this_local;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_001b1220;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (this->contexts[local_14].m_byte_used != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,this->contexts[local_14].m_byte_used);
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,this->contexts[local_14].m_rgb_diff_0);
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,this->contexts[local_14].m_rgb_diff_1);
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,this->contexts[local_14].m_rgb_diff_2);
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,this->contexts[local_14].m_rgb_diff_3);
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,this->contexts[local_14].m_rgb_diff_4);
      ArithmeticEncoder::destroySymbolModel(this->enc_RGB,this->contexts[local_14].m_rgb_diff_5);
    }
  }
  if (this->outstream_RGB != (ByteStreamOutArray *)0x0) {
    if (this->outstream_RGB != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_RGB->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    this_00 = this->enc_RGB;
    if (this_00 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(this_00);
      operator_delete(this_00);
    }
  }
  LASwriteItemCompressed::~LASwriteItemCompressed(&this->super_LASwriteItemCompressed);
  return;
}

Assistant:

LASwriteItemCompressed_RGB14_v4::~LASwriteItemCompressed_RGB14_v4()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_byte_used)
    {
      enc_RGB->destroySymbolModel(contexts[c].m_byte_used);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_0);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_1);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_2);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_3);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_4);
      enc_RGB->destroySymbolModel(contexts[c].m_rgb_diff_5);
    }
  }

  /* destroy all outstreams and encoders */

  if (outstream_RGB)
  {
    delete outstream_RGB;

    delete enc_RGB;
  }
}